

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

void tcu::astc::anon_unknown_0::generateRandomBlock(deUint8 *dst,IVec3 *blockSize,Random *rnd)

{
  deFloat16 dVar1;
  deBool dVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  deUint32 dVar7;
  uint uVar8;
  uint uVar9;
  ISEParams IVar10;
  long lVar11;
  long lVar12;
  int extraout_EDX;
  int extraout_EDX_00;
  ulong *puVar13;
  NormalBlockISEInputs *pNVar14;
  deUint8 *pdVar15;
  int i;
  ulong uVar16;
  ulong uVar17;
  ISEMode IVar18;
  int iVar19;
  ulong uVar20;
  bool bVar21;
  float fVar22;
  AssignBlock128 AVar23;
  NormalBlockParams blockParams;
  NormalBlockISEInputs iseInputs;
  NormalBlockParams local_c9c;
  deUint8 *local_c68;
  NormalBlockISEInputs *local_c60;
  ulong local_c58;
  long local_c50;
  Word local_c48 [2];
  ulong local_c38 [192];
  undefined1 local_634 [1540];
  
  local_c68 = dst;
  fVar22 = deRandom_getFloat(&rnd->m_rnd);
  if (0.1 <= fVar22) {
    local_c9c.weightGridWidth = -1;
    local_c9c.weightGridHeight = -1;
    local_c9c.weightISEParams.mode = ISEMODE_LAST;
    local_c9c.weightISEParams.numBits = -1;
    local_c9c.isDualPlane = true;
    local_c9c.ccs = 0xffffffff;
    local_c9c.numPartitions = -1;
    local_c9c.isMultiPartSingleCemMode = false;
    local_c9c.partitionSeed = 0xffffffff;
    local_c9c.colorEndpointModes[0] = 0;
    local_c9c.colorEndpointModes[1] = 0;
    local_c9c.colorEndpointModes[2] = 0;
    local_c9c.colorEndpointModes[3] = 0;
    do {
      iVar19 = blockSize->m_data[0];
      dVar7 = deRandom_getUint32(&rnd->m_rnd);
      iVar4 = 0;
      local_c9c.weightGridWidth = dVar7 % (iVar19 - 1U) + 2;
      iVar19 = blockSize->m_data[1];
      dVar7 = deRandom_getUint32(&rnd->m_rnd);
      local_c9c.weightGridHeight = dVar7 % (iVar19 - 1U) + 2;
      dVar7 = deRandom_getUint32(&rnd->m_rnd);
      local_c9c.weightISEParams =
           *(ISEParams *)(&astc::(anonymous_namespace)::s_weightISEParamsCandidates + dVar7 % 0xc);
      dVar7 = deRandom_getUint32(&rnd->m_rnd);
      local_c9c.numPartitions = (dVar7 & 3) + 1;
      fVar22 = deRandom_getFloat(&rnd->m_rnd);
      local_c9c.isMultiPartSingleCemMode = fVar22 < 0.25;
      bVar21 = false;
      if (local_c9c.numPartitions != 4) {
        dVar2 = deRandom_getBool(&rnd->m_rnd);
        bVar21 = dVar2 == 1;
      }
      local_c9c.isDualPlane = bVar21;
      dVar7 = deRandom_getUint32(&rnd->m_rnd);
      local_c9c._20_8_ = CONCAT44(local_c9c.numPartitions,dVar7) & 0xffffffff00000003;
      dVar7 = deRandom_getUint32(&rnd->m_rnd);
      local_c9c.partitionSeed = dVar7 & 0x3ff;
      dVar7 = deRandom_getUint32(&rnd->m_rnd);
      local_c9c.colorEndpointModes._0_8_ =
           CONCAT44(local_c9c.colorEndpointModes[1],dVar7) & 0xffffffff0000000f;
      if (local_c9c.isMultiPartSingleCemMode == false) {
        if ((dVar7 & 0xf) == 0) {
          iVar4 = 1;
        }
        else if ((dVar7 & 0xf) == 0xf) {
          iVar4 = -1;
        }
        else {
          dVar2 = deRandom_getBool(&rnd->m_rnd);
          iVar4 = (uint)(dVar2 == 1) * 2 + -1;
        }
      }
      if (1 < local_c9c.numPartitions) {
        lVar11 = 8;
        do {
          dVar7 = local_c9c.colorEndpointModes[0];
          if (iVar4 == 1) {
            dVar3 = deRandom_getUint32(&rnd->m_rnd);
            uVar6 = dVar3 & 1;
          }
          else {
            uVar6 = 0;
            if (iVar4 == -1) {
              dVar3 = deRandom_getUint32(&rnd->m_rnd);
              uVar6 = (dVar3 & 1) - 1;
            }
          }
          local_c9c.colorEndpointModes[lVar11 + -7] = uVar6 + dVar7;
          lVar12 = lVar11 + -6;
          lVar11 = lVar11 + 1;
        } while (lVar12 < local_c9c.numPartitions);
      }
      bVar21 = isValidBlockParams(&local_c9c,blockSize->m_data[0],blockSize->m_data[1]);
    } while (!bVar21);
    pNVar14 = (NormalBlockISEInputs *)0x0;
    local_c38[0] = local_c38[0] & 0xffffffffffffff00;
    local_634[0] = 0;
    do {
      if ((int)pNVar14 == 0) {
        uVar20 = (ulong)(uint)(local_c9c.weightGridHeight * local_c9c.weightGridWidth <<
                              (local_c9c.isDualPlane & 0x1fU));
      }
      else if (local_c9c.isMultiPartSingleCemMode == false) {
        if (local_c9c.numPartitions < 1) {
          uVar20 = 0;
        }
        else {
          uVar16 = 0;
          uVar20 = 0;
          do {
            uVar20 = (ulong)((int)uVar20 + (local_c9c.colorEndpointModes[uVar16] >> 2) * 2 + 2);
            uVar16 = uVar16 + 1;
          } while ((uint)local_c9c.numPartitions != uVar16);
        }
      }
      else {
        uVar20 = (ulong)(((local_c9c.colorEndpointModes[0] >> 2) * 2 + 2) * local_c9c.numPartitions)
        ;
      }
      iVar19 = (int)uVar20;
      local_c60 = pNVar14;
      if ((int)pNVar14 == 0) {
        puVar13 = local_c38;
        IVar10 = local_c9c.weightISEParams;
      }
      else {
        iVar4 = local_c9c.weightGridHeight * local_c9c.weightGridWidth <<
                (local_c9c.isDualPlane & 0x1fU);
        if (local_c9c.weightISEParams.mode == ISEMODE_PLAIN_BIT) {
          iVar5 = iVar4 * local_c9c.weightISEParams.numBits;
        }
        else {
          if (local_c9c.weightISEParams.mode == ISEMODE_QUINT) {
            iVar5 = (iVar4 * 7) / 3;
            bVar21 = iVar4 * -0x55555553 + 0x2aaaaaaaU < 0x55555555;
          }
          else {
            iVar5 = -1;
            if (local_c9c.weightISEParams.mode != ISEMODE_TRIT) goto LAB_00aca5c0;
            iVar5 = (iVar4 * 8) / 5;
            bVar21 = iVar4 * 0x66666668 + 0x19999999U < 0x33333333;
          }
          iVar5 = iVar4 * local_c9c.weightISEParams.numBits + ((iVar5 + 1) - (uint)bVar21);
        }
LAB_00aca5c0:
        iVar4 = -0x11;
        if ((local_c9c.numPartitions != 1) &&
           (iVar4 = -0x1d, local_c9c.isMultiPartSingleCemMode == false)) {
          iVar4 = local_c9c.numPartitions * -3 + -0x19;
        }
        IVar10 = computeMaximumRangeISEParams
                           (((uint)(local_c9c.isDualPlane ^ 1) * 2 - iVar5) + iVar4 + 0x7e,iVar19);
        puVar13 = (ulong *)local_634;
      }
      dVar2 = deRandom_getBool(&rnd->m_rnd);
      *(bool *)puVar13 = dVar2 == 1;
      IVar18 = IVar10.mode;
      if (dVar2 == 1) {
        uVar6 = (uint)(IVar18 == ISEMODE_QUINT) * 2 + 1;
        if (IVar18 == ISEMODE_TRIT) {
          uVar6 = 5;
        }
        iVar4 = iVar19 % (int)uVar6;
        uVar8 = (iVar19 / (int)uVar6 + 1) - (uint)(iVar4 == 0);
        if (0 < (int)uVar8) {
          local_c50 = (long)puVar13 + 4;
          local_c58 = (ulong)uVar8;
          puVar13 = puVar13 + 1;
          uVar20 = 0;
          do {
            dVar7 = deRandom_getUint32(&rnd->m_rnd);
            *(deUint32 *)(local_c50 + uVar20 * 0x18) = dVar7 & 0xff;
            uVar16 = 0;
            do {
              dVar7 = deRandom_getUint32(&rnd->m_rnd);
              *(deUint32 *)((long)puVar13 + uVar16 * 4) =
                   dVar7 & ~(-1 << ((byte)IVar10.numBits & 0x1f));
              uVar16 = uVar16 + 1;
            } while (uVar6 != uVar16);
            uVar20 = uVar20 + 1;
            puVar13 = puVar13 + 3;
            iVar4 = extraout_EDX_00;
          } while (uVar20 != local_c58);
        }
      }
      else {
        if (IVar18 == ISEMODE_PLAIN_BIT) {
          iVar4 = 1;
LAB_00aca6dd:
          uVar16 = (ulong)(uint)(iVar4 << ((byte)IVar10.numBits & 0x1f));
        }
        else {
          if (IVar18 == ISEMODE_QUINT) {
            iVar4 = 5;
            goto LAB_00aca6dd;
          }
          uVar16 = 0;
          if (IVar18 == ISEMODE_TRIT) {
            iVar4 = 3;
            goto LAB_00aca6dd;
          }
        }
        iVar4 = extraout_EDX;
        if (0 < iVar19) {
          uVar17 = 0;
          do {
            dVar7 = deRandom_getUint32(&rnd->m_rnd);
            iVar4 = (int)((ulong)dVar7 % uVar16);
            *(int *)((long)puVar13 + uVar17 * 4 + 4) = iVar4;
            uVar17 = uVar17 + 1;
          } while (uVar20 != uVar17);
        }
      }
      pNVar14 = (NormalBlockISEInputs *)(ulong)((int)local_c60 + 1);
    } while ((int)local_c60 == 0);
    AVar23 = generateNormalBlock(&local_c9c,(int)local_c38,iVar4,local_c60);
    local_c48[0] = AVar23.m_words[0];
    local_c48[1] = AVar23.m_words[1];
    lVar11 = 0;
    do {
      uVar20 = local_c38[lVar11 + -2];
      lVar12 = 0;
      pdVar15 = local_c68;
      do {
        *pdVar15 = (deUint8)(uVar20 >> ((byte)lVar12 & 0x3f));
        pdVar15 = pdVar15 + 1;
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x40);
      local_c68 = local_c68 + 8;
      bVar21 = lVar11 == 0;
      lVar11 = lVar11 + 1;
    } while (bVar21);
  }
  else {
    dVar2 = deRandom_getBool(&rnd->m_rnd);
    if (dVar2 == 1) {
      fVar22 = deRandom_getFloat(&rnd->m_rnd);
      dVar1 = deFloat32To16(fVar22 + 0.0);
      uVar6 = (uint)dVar1;
      fVar22 = deRandom_getFloat(&rnd->m_rnd);
      dVar1 = deFloat32To16(fVar22 + 0.0);
      dVar7 = (deUint32)dVar1;
      fVar22 = deRandom_getFloat(&rnd->m_rnd);
      dVar1 = deFloat32To16(fVar22 + 0.0);
      uVar8 = (uint)dVar1;
      fVar22 = deRandom_getFloat(&rnd->m_rnd);
      dVar1 = deFloat32To16(fVar22 + 0.0);
      uVar9 = (uint)dVar1;
      local_c38[0] = 0xfffffffffffffffc;
    }
    else {
      uVar6 = deRandom_getUint32(&rnd->m_rnd);
      dVar7 = deRandom_getUint32(&rnd->m_rnd);
      uVar8 = deRandom_getUint32(&rnd->m_rnd);
      uVar9 = deRandom_getUint32(&rnd->m_rnd);
      local_c38[0] = 0xfffffffffffffdfc;
    }
    local_c38[1] = (ulong)(uVar9 & 0xffff) << 0x30 |
                   CONCAT44(uVar8,dVar7 << 0x10 | uVar6 & 0xffff) & 0xffffffffffff;
    lVar11 = 0;
    do {
      uVar20 = local_c38[lVar11];
      lVar12 = 0;
      pdVar15 = local_c68;
      do {
        *pdVar15 = (deUint8)(uVar20 >> ((byte)lVar12 & 0x3f));
        pdVar15 = pdVar15 + 1;
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0x40);
      local_c68 = local_c68 + 8;
      bVar21 = lVar11 == 0;
      lVar11 = lVar11 + 1;
    } while (bVar21);
  }
  return;
}

Assistant:

void generateRandomBlock (deUint8* dst, const IVec3& blockSize, de::Random& rnd)
{
	DE_ASSERT(blockSize.z() == 1);

	if (rnd.getFloat() < 0.1f)
	{
		// Void extent block.
		const bool		isVoidExtentHDR		= rnd.getBool();
		const deUint16	r					= isVoidExtentHDR ? deFloat32To16(rnd.getFloat(0.0f, 1.0f)) : (deUint16)rnd.getInt(0, 0xffff);
		const deUint16	g					= isVoidExtentHDR ? deFloat32To16(rnd.getFloat(0.0f, 1.0f)) : (deUint16)rnd.getInt(0, 0xffff);
		const deUint16	b					= isVoidExtentHDR ? deFloat32To16(rnd.getFloat(0.0f, 1.0f)) : (deUint16)rnd.getInt(0, 0xffff);
		const deUint16	a					= isVoidExtentHDR ? deFloat32To16(rnd.getFloat(0.0f, 1.0f)) : (deUint16)rnd.getInt(0, 0xffff);
		generateVoidExtentBlock(VoidExtentParams(isVoidExtentHDR, r, g, b, a)).assignToMemory(dst);
	}
	else
	{
		// Not void extent block.

		// Generate block params.

		NormalBlockParams blockParams;

		do
		{
			blockParams.weightGridWidth				= rnd.getInt(2, blockSize.x());
			blockParams.weightGridHeight			= rnd.getInt(2, blockSize.y());
			blockParams.weightISEParams				= s_weightISEParamsCandidates[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates)-1)];
			blockParams.numPartitions				= rnd.getInt(1, 4);
			blockParams.isMultiPartSingleCemMode	= rnd.getFloat() < 0.25f;
			blockParams.isDualPlane					= blockParams.numPartitions != 4 && rnd.getBool();
			blockParams.ccs							= rnd.getInt(0, 3);
			blockParams.partitionSeed				= rnd.getInt(0, 1023);

			blockParams.colorEndpointModes[0] = rnd.getInt(0, 15);

			{
				const int cemDiff = blockParams.isMultiPartSingleCemMode		? 0
									: blockParams.colorEndpointModes[0] == 0	? 1
									: blockParams.colorEndpointModes[0] == 15	? -1
									: rnd.getBool()								? 1 : -1;

				for (int i = 1; i < blockParams.numPartitions; i++)
					blockParams.colorEndpointModes[i] = blockParams.colorEndpointModes[0] + (cemDiff == -1 ? rnd.getInt(-1, 0) : cemDiff == 1 ? rnd.getInt(0, 1) : 0);
			}
		} while (!isValidBlockParams(blockParams, blockSize.x(), blockSize.y()));

		// Generate ISE inputs for both weight and endpoint data.

		NormalBlockISEInputs iseInputs;

		for (int weightOrEndpoints = 0; weightOrEndpoints <= 1; weightOrEndpoints++)
		{
			const bool			setWeights	= weightOrEndpoints == 0;
			const int			numValues	= setWeights ? computeNumWeights(blockParams) :
												computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], blockParams.numPartitions, blockParams.isMultiPartSingleCemMode);
			const ISEParams		iseParams	= setWeights ? blockParams.weightISEParams : computeMaximumRangeISEParams(computeNumBitsForColorEndpoints(blockParams), numValues);
			ISEInput&			iseInput	= setWeights ? iseInputs.weight : iseInputs.endpoint;

			iseInput.isGivenInBlockForm = rnd.getBool();

			if (iseInput.isGivenInBlockForm)
			{
				const int numValuesPerISEBlock	= iseParams.mode == ISEMODE_TRIT	? 5
												: iseParams.mode == ISEMODE_QUINT	? 3
												:									  1;
				const int iseBitMax				= (1 << iseParams.numBits) - 1;
				const int numISEBlocks			= deDivRoundUp32(numValues, numValuesPerISEBlock);

				for (int iseBlockNdx = 0; iseBlockNdx < numISEBlocks; iseBlockNdx++)
				{
					iseInput.value.block[iseBlockNdx].tOrQValue = rnd.getInt(0, 255);
					for (int i = 0; i < numValuesPerISEBlock; i++)
						iseInput.value.block[iseBlockNdx].bitValues[i] = rnd.getInt(0, iseBitMax);
				}
			}
			else
			{
				const int rangeMax = computeISERangeMax(iseParams);

				for (int valueNdx = 0; valueNdx < numValues; valueNdx++)
					iseInput.value.plain[valueNdx] = rnd.getInt(0, rangeMax);
			}
		}

		generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).assignToMemory(dst);
	}
}